

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::FileGenerator
          (FileGenerator *this,FileDescriptor *file,Options *options)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  mapped_type *pmVar4;
  string *psVar5;
  ulong uVar6;
  size_type sVar7;
  MessageGenerator *this_00;
  reference ppDVar8;
  EnumGenerator *this_01;
  EnumDescriptor *descriptor;
  ServiceGenerator *this_02;
  ServiceDescriptor *descriptor_00;
  reference this_03;
  pointer pSVar9;
  ExtensionGenerator *this_04;
  FieldDescriptor *descriptor_01;
  Options *pOVar10;
  FileDescriptor *local_338;
  int local_32c;
  ExtensionGenerator *pEStack_328;
  int i_5;
  int local_320;
  int local_31c;
  int i_4;
  int i_3;
  int local_30c;
  EnumGenerator *pEStack_308;
  int i_2;
  int local_2fc;
  MessageGenerator *pMStack_2f8;
  int i_1;
  MessageGenerator *msg_gen;
  undefined1 local_2e8 [4];
  int i;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  msgs;
  key_type local_2c8;
  string local_2a8;
  allocator local_281;
  key_type local_280;
  allocator local_259;
  key_type local_258;
  allocator local_231;
  string local_230;
  string local_210;
  allocator local_1e9;
  key_type local_1e8;
  allocator local_1c1;
  string local_1c0;
  string local_1a0;
  allocator local_179;
  key_type local_178;
  string local_158;
  allocator local_131;
  key_type local_130;
  allocator local_109;
  string local_108;
  string local_e8;
  allocator local_c1;
  key_type local_c0;
  allocator local_99;
  string local_98;
  string local_78;
  allocator local_51;
  key_type local_50;
  Options *local_20;
  Options *options_local;
  FileDescriptor *file_local;
  FileGenerator *this_local;
  
  local_20 = options;
  options_local = (Options *)file;
  file_local = (FileDescriptor *)this;
  std::
  set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
  ::set(&this->weak_deps_);
  this->file_ = (FileDescriptor *)options_local;
  Options::Options(&this->options_,local_20);
  MessageSCCAnalyzer::MessageSCCAnalyzer(&this->scc_analyzer_,local_20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->variables_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
  ::vector(&this->message_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
  ::vector(&this->enum_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
  ::vector(&this->service_generators_);
  std::
  vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
  ::vector(&this->extension_generators_);
  SetCommonVars(local_20,&this->variables_);
  pOVar10 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,"dllexport_decl",&local_51);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_50);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)pOVar10);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_98,"TableStruct",&local_99);
  UniqueName(&local_78,&local_98,this->file_,&this->options_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_c0,"tablename",&local_c1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_c0);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_108,"file_level_metadata",&local_109);
  pOVar10 = &this->options_;
  UniqueName(&local_e8,&local_108,this->file_,pOVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_130,"file_level_metadata",&local_131);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_130);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  DescriptorTableName_abi_cxx11_
            (&local_158,(cpp *)this->file_,(FileDescriptor *)&this->options_,pOVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_178,"desc_table",&local_179);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_178);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1c0,"file_level_enum_descriptors",&local_1c1);
  UniqueName(&local_1a0,&local_1c0,this->file_,&this->options_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_1e8,"file_level_enum_descriptors",&local_1e9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_1e8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_230,"file_level_service_descriptors",&local_231);
  pOVar10 = &this->options_;
  UniqueName(&local_210,&local_230,this->file_,pOVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_258,"file_level_service_descriptors",&local_259);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_258);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_210);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_230);
  std::allocator<char>::~allocator((allocator<char> *)&local_231);
  psVar5 = FileDescriptor::name_abi_cxx11_(this->file_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_280,"filename",&local_281);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_280);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)psVar5);
  std::__cxx11::string::~string((string *)&local_280);
  std::allocator<char>::~allocator((allocator<char> *)&local_281);
  Namespace_abi_cxx11_(&local_2a8,(cpp *)this->file_,(FileDescriptor *)local_20,pOVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_2c8,"package_ns",
             (allocator *)
             ((long)&msgs.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&this->variables_,&local_2c8);
  std::__cxx11::string::operator=((string *)pmVar4,(string *)&local_2a8);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&msgs.
                     super__Vector_base<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_2a8);
  FlattenMessagesInFile
            ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              *)local_2e8,(FileDescriptor *)options_local);
  for (msg_gen._4_4_ = 0; uVar6 = (ulong)msg_gen._4_4_,
      sVar7 = std::
              vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::size((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)local_2e8), uVar6 < sVar7; msg_gen._4_4_ = msg_gen._4_4_ + 1) {
    this_00 = (MessageGenerator *)operator_new(0x220);
    ppDVar8 = std::
              vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
              ::operator[]((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                            *)local_2e8,(long)msg_gen._4_4_);
    MessageGenerator::MessageGenerator
              (this_00,*ppDVar8,&this->variables_,msg_gen._4_4_,local_20,&this->scc_analyzer_);
    pMStack_2f8 = this_00;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::MessageGenerator*&>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>
                *)&this->message_generators_,&stack0xfffffffffffffd08);
    MessageGenerator::AddGenerators
              (pMStack_2f8,&this->enum_generators_,&this->extension_generators_);
  }
  for (local_2fc = 0; iVar1 = local_2fc,
      iVar3 = FileDescriptor::enum_type_count((FileDescriptor *)options_local), iVar1 < iVar3;
      local_2fc = local_2fc + 1) {
    this_01 = (EnumGenerator *)operator_new(0x68);
    descriptor = FileDescriptor::enum_type((FileDescriptor *)options_local,local_2fc);
    EnumGenerator::EnumGenerator(this_01,descriptor,&this->variables_,local_20);
    pEStack_308 = this_01;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::EnumGenerator*>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>>>>
                *)&this->enum_generators_,&stack0xfffffffffffffcf8);
  }
  for (local_30c = 0; iVar1 = local_30c,
      iVar3 = FileDescriptor::service_count((FileDescriptor *)options_local), iVar1 < iVar3;
      local_30c = local_30c + 1) {
    this_02 = (ServiceGenerator *)operator_new(0x48);
    descriptor_00 = FileDescriptor::service((FileDescriptor *)options_local,local_30c);
    ServiceGenerator::ServiceGenerator(this_02,descriptor_00,&this->variables_,local_20);
    _i_4 = this_02;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::ServiceGenerator*>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>>>>
                *)&this->service_generators_,(ServiceGenerator **)&i_4);
  }
  bVar2 = HasGenericServices(this->file_,&this->options_);
  if (bVar2) {
    for (local_31c = 0; uVar6 = (ulong)local_31c,
        sVar7 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                ::size(&this->service_generators_), iVar1 = local_31c, uVar6 < sVar7;
        local_31c = local_31c + 1) {
      this_03 = std::
                vector<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                ::operator[](&this->service_generators_,(long)local_31c);
      pSVar9 = std::
               unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
               ::operator->(this_03);
      pSVar9->index_in_metadata_ = iVar1;
    }
  }
  for (local_320 = 0; iVar1 = local_320,
      iVar3 = FileDescriptor::extension_count((FileDescriptor *)options_local), iVar1 < iVar3;
      local_320 = local_320 + 1) {
    this_04 = (ExtensionGenerator *)operator_new(0x150);
    descriptor_01 = FileDescriptor::extension((FileDescriptor *)options_local,local_320);
    ExtensionGenerator::ExtensionGenerator(this_04,descriptor_01,local_20,&this->scc_analyzer_);
    pEStack_328 = this_04;
    std::
    vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
    ::emplace_back<google::protobuf::compiler::cpp::ExtensionGenerator*>
              ((vector<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>>>>
                *)&this->extension_generators_,&stack0xfffffffffffffcd8);
  }
  for (local_32c = 0; iVar1 = local_32c,
      iVar3 = FileDescriptor::weak_dependency_count((FileDescriptor *)options_local), iVar1 < iVar3;
      local_32c = local_32c + 1) {
    local_338 = FileDescriptor::weak_dependency((FileDescriptor *)options_local,local_32c);
    std::
    set<const_google::protobuf::FileDescriptor_*,_std::less<const_google::protobuf::FileDescriptor_*>,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
    ::insert(&this->weak_deps_,&local_338);
  }
  std::
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  ::~vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
             *)local_2e8);
  return;
}

Assistant:

FileGenerator::FileGenerator(const FileDescriptor* file, const Options& options)
    : file_(file), options_(options), scc_analyzer_(options) {
  // These variables are the same on a file level
  SetCommonVars(options, &variables_);
  variables_["dllexport_decl"] = options.dllexport_decl;
  variables_["tablename"] = UniqueName("TableStruct", file_, options_);
  variables_["file_level_metadata"] =
      UniqueName("file_level_metadata", file_, options_);
  variables_["desc_table"] = DescriptorTableName(file_, options_);
  variables_["file_level_enum_descriptors"] =
      UniqueName("file_level_enum_descriptors", file_, options_);
  variables_["file_level_service_descriptors"] =
      UniqueName("file_level_service_descriptors", file_, options_);
  variables_["filename"] = file_->name();
  variables_["package_ns"] = Namespace(file_, options);

  std::vector<const Descriptor*> msgs = FlattenMessagesInFile(file);
  for (int i = 0; i < msgs.size(); i++) {
    // Deleted in destructor
    MessageGenerator* msg_gen =
        new MessageGenerator(msgs[i], variables_, i, options, &scc_analyzer_);
    message_generators_.emplace_back(msg_gen);
    msg_gen->AddGenerators(&enum_generators_, &extension_generators_);
  }

  for (int i = 0; i < file->enum_type_count(); i++) {
    enum_generators_.emplace_back(
        new EnumGenerator(file->enum_type(i), variables_, options));
  }

  for (int i = 0; i < file->service_count(); i++) {
    service_generators_.emplace_back(
        new ServiceGenerator(file->service(i), variables_, options));
  }
  if (HasGenericServices(file_, options_)) {
    for (int i = 0; i < service_generators_.size(); i++) {
      service_generators_[i]->index_in_metadata_ = i;
    }
  }
  for (int i = 0; i < file->extension_count(); i++) {
    extension_generators_.emplace_back(
        new ExtensionGenerator(file->extension(i), options, &scc_analyzer_));
  }
  for (int i = 0; i < file->weak_dependency_count(); ++i) {
    weak_deps_.insert(file->weak_dependency(i));
  }
}